

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O0

ll_node * parse_arg_range(int from,int count,int *end,char **argv,char *prefix)

{
  char *__s;
  char *root;
  int iVar1;
  size_t sVar2;
  bool bVar3;
  char *local_58;
  char *val;
  cli_option option;
  int i;
  char *prefix_local;
  char **argv_local;
  int *end_local;
  int count_local;
  int from_local;
  
  if ((((from < count) && (-1 < from)) && (argv != (char **)0x0)) && (prefix != (char *)0x0)) {
    option.values._4_4_ = from;
    iVar1 = starts_with(prefix,argv[from]);
    if (iVar1 == 0) {
      local_58 = (char *)0x0;
    }
    else {
      local_58 = argv[option.values._4_4_];
    }
    val = local_58;
    option.name = (char *)0x0;
    if (local_58 != (char *)0x0) {
      option.values._4_4_ = option.values._4_4_ + 1;
    }
    while( true ) {
      bVar3 = false;
      if (option.values._4_4_ < count) {
        iVar1 = starts_with(prefix,argv[option.values._4_4_]);
        bVar3 = iVar1 == 0;
      }
      root = option.name;
      if (!bVar3) break;
      __s = argv[option.values._4_4_];
      if (option.name == (char *)0x0) {
        sVar2 = strlen(__s);
        option.name = (char *)ll_create_node(__s,sVar2 + 1);
      }
      else {
        sVar2 = strlen(__s);
        ll_append((ll_node *)root,__s,sVar2 + 1);
      }
      option.values._4_4_ = option.values._4_4_ + 1;
    }
    *end = option.values._4_4_;
    _count_local = ll_create_node(&val,0x10);
  }
  else {
    _count_local = (ll_node *)0x0;
  }
  return _count_local;
}

Assistant:

static struct ll_node *parse_arg_range(int from, int count, int *end,
									   const char *argv[], const char *prefix)
{
	int i = from;
	struct cli_option option;
	if (from >= count || from < 0 || argv == NULL || prefix == NULL) {
		return NULL;
	}
	option.name = starts_with(prefix, argv[i]) ? (char *)argv[i] : NULL;
	option.values = NULL;
	if (option.name != NULL) {
		i++;
	}
	from = i;
	while (i < count && !starts_with(prefix, argv[i])) {
		const char *val = argv[i];
		if (option.values == NULL) {
			option.values = ll_create_node(val, strlen(val) + 1);
		} else {
			ll_append(option.values, val, strlen(val) + 1);
		}
		i++;
	}
	*end = i;
	return ll_create_node(&option, sizeof(struct cli_option));
}